

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::FenceSyncCase::FenceSyncCase
          (FenceSyncCase *this,Context *context,char *name,char *description,int numSyncs,
          deUint32 waitCommand)

{
  int iVar1;
  deUint32 seed;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  allocator<__GLsync_*> local_3d [13];
  deUint32 local_30;
  int local_2c;
  deUint32 waitCommand_local;
  int numSyncs_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  FenceSyncCase *this_local;
  
  local_30 = waitCommand;
  local_2c = numSyncs;
  _waitCommand_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  pRVar2 = gles3::Context::getRenderContext((Context *)name_local);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_00 = gles3::Context::getTestContext((Context *)name_local);
  log = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FenceSyncCase_032ba238;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = local_2c;
  this->m_waitCommand = local_30;
  this->m_program = (ShaderProgram *)0x0;
  std::allocator<__GLsync_*>::allocator(local_3d);
  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::vector(&this->m_syncObjects,0,local_3d);
  std::allocator<__GLsync_*>::~allocator(local_3d);
  this->m_iterNdx = 0;
  seed = deStringHash(description_local);
  de::Random::Random(&this->m_rnd,seed);
  return;
}

Assistant:

FenceSyncCase::FenceSyncCase (Context& context, const char* name, const char* description, int numSyncs, deUint32 waitCommand)
	: TestCase			(context, name, description)
	, CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_numSyncs		(numSyncs)
	, m_waitCommand		(waitCommand)
	, m_program			(DE_NULL)
	, m_syncObjects		(DE_NULL)
	, m_iterNdx			(0)
	, m_rnd				(deStringHash(name))
{
}